

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O0

void cleanup_parse_ui_entry_renderer(void)

{
  wchar_t local_c;
  wchar_t i;
  
  for (local_c = L'\0'; local_c < renderer_count; local_c = local_c + L'\x01') {
    mem_free(renderers[local_c].symbols);
    mem_free(renderers[local_c].label_colors);
    mem_free(renderers[local_c].colors);
    string_free(renderers[local_c].comb_rend_nm);
    string_free(renderers[local_c].name);
  }
  mem_free(renderers);
  renderers = (renderer_info *)0x0;
  renderer_count = L'\0';
  renderer_allocated = L'\0';
  return;
}

Assistant:

static void cleanup_parse_ui_entry_renderer(void)
{
	int i;

	for (i = 0; i < renderer_count; i++) {
		mem_free(renderers[i].symbols);
		mem_free(renderers[i].label_colors);
		mem_free(renderers[i].colors);
		string_free(renderers[i].comb_rend_nm);
		string_free(renderers[i].name);
	}
	mem_free(renderers);
	renderers = NULL;
	renderer_count = 0;
	renderer_allocated = 0;
}